

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ret0.cxx
# Opt level: O0

int main(int ac,char **av)

{
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  duration<double,_std::ratio<1L,_1L>_> timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_210;
  const_iterator local_208;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1fd;
  undefined1 local_1fc;
  allocator<char> local_1fb;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_1d0 [32];
  string local_1b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  iterator local_170;
  size_type local_168;
  undefined1 local_160 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  callargs;
  int callarg_pos;
  allocator<char> local_139;
  string local_138 [8];
  string arg_1;
  int i_1;
  int lastarg_pos;
  int local_f0;
  allocator<char> local_e9;
  string local_e8 [8];
  string arg;
  undefined1 local_c0 [4];
  int i;
  string logfile;
  string local_98 [6];
  bool exec;
  bool nextarg;
  string logarg;
  string local_70 [8];
  string exename;
  char **argv;
  undefined1 local_30 [4];
  int argc;
  CommandLineArguments args;
  char **av_local;
  int ac_local;
  
  av_local._4_4_ = 0;
  args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = av;
  cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)local_30,ac,av);
  iVar2 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)local_30);
  exename.field_2._8_8_ =
       cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)local_30);
  pcVar1 = *(char **)exename.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,pcVar1,(allocator<char> *)(logarg.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(logarg.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_98);
  logfile.field_2._M_local_buf[0xf] = '\0';
  logfile.field_2._M_local_buf[0xe] = '\0';
  lVar3 = std::__cxx11::string::find((char *)local_70,0x3ae004);
  if (lVar3 == -1) {
    lVar3 = std::__cxx11::string::find((char *)local_70,0x3ae019);
    if (lVar3 == -1) {
      lVar3 = std::__cxx11::string::find((char *)local_70,0x3ae020);
      if (lVar3 == -1) {
        lVar3 = std::__cxx11::string::find((char *)local_70,0x3ae026);
        if (lVar3 != -1) {
          logfile.field_2._M_local_buf[0xf] = '\x01';
          logfile.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::operator=(local_98,"--log-file");
        }
      }
      else {
        logfile.field_2._M_local_buf[0xf] = '\x01';
        std::__cxx11::string::operator=(local_98,"/X");
      }
    }
    else {
      std::__cxx11::string::operator=(local_98,"-log-file=");
    }
  }
  else {
    std::__cxx11::string::operator=(local_98,"--log-file=");
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::string((string *)local_c0);
    for (arg.field_2._12_4_ = 1; (int)arg.field_2._12_4_ < iVar2;
        arg.field_2._12_4_ = arg.field_2._12_4_ + 1) {
      pcVar1 = *(char **)(exename.field_2._8_8_ + (long)(int)arg.field_2._12_4_ * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e8,pcVar1,&local_e9);
      std::allocator<char>::~allocator(&local_e9);
      lVar3 = std::__cxx11::string::find(local_e8,(ulong)local_98);
      if (lVar3 == 0) {
        if ((logfile.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)&i_1,(ulong)local_e8);
          std::__cxx11::string::operator=((string *)local_c0,(string *)&i_1);
          std::__cxx11::string::~string((string *)&i_1);
          goto LAB_00112766;
        }
        if (arg.field_2._12_4_ != iVar2 + -1) {
          std::__cxx11::string::operator=
                    ((string *)local_c0,
                     *(char **)(exename.field_2._8_8_ + 8 + (long)(int)arg.field_2._12_4_ * 8));
          goto LAB_00112766;
        }
        av_local._4_4_ = 1;
        local_f0 = 1;
      }
      else {
LAB_00112766:
        local_f0 = 0;
      }
      std::__cxx11::string::~string(local_e8);
      if (local_f0 != 0) goto LAB_00112cce;
    }
    arg_1.field_2._12_4_ = 1;
    for (arg_1.field_2._8_4_ = 1; (int)arg_1.field_2._8_4_ < iVar2;
        arg_1.field_2._8_4_ = arg_1.field_2._8_4_ + 1) {
      pcVar1 = *(char **)(exename.field_2._8_8_ + (long)(int)arg_1.field_2._8_4_ * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_138,pcVar1,&local_139);
      std::allocator<char>::~allocator(&local_139);
      lVar3 = std::__cxx11::string::find((char *)local_138,0x3ae03f);
      if (lVar3 == 0) {
        arg_1.field_2._12_4_ = arg_1.field_2._8_4_;
      }
      std::__cxx11::string::~string(local_138);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      register0x00000000 = cmsys::SystemTools::Touch((string *)local_c0,true);
      iVar5 = 1;
      if ((logfile.field_2._M_local_buf[0xf] & 1U) != 0) {
        iVar5 = 2;
      }
      callargs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = arg_1.field_2._12_4_ + iVar5;
      if (((logfile.field_2._M_local_buf[0xe] & 1U) != 0) &&
         ((int)callargs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage < iVar2)) {
        local_1fc = 1;
        local_1f8 = &local_1f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"/usr/bin/cmake",&local_1f9);
        local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1d0,"-E",&local_1fa);
        local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1b0,"env",&local_1fb);
        local_1f8 = &local_190;
        std::operator+(local_1f8,"PSEUDO_LOGFILE=",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
        local_1fc = 0;
        local_170 = &local_1f0;
        local_168 = 4;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_1fd);
        __l._M_len = local_168;
        __l._M_array = local_170;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_160,__l,&local_1fd);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_1fd);
        local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_170;
        do {
          local_2b0 = local_2b0 + -1;
          std::__cxx11::string::~string((string *)local_2b0);
        } while (local_2b0 != &local_1f0);
        std::allocator<char>::~allocator(&local_1fb);
        std::allocator<char>::~allocator(&local_1fa);
        std::allocator<char>::~allocator(&local_1f9);
        local_210._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_160);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_208,&local_210);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<char_const*const*,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_160,
                   local_208,
                   (char **)(exename.field_2._8_8_ +
                            (long)(int)callargs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage * 8),
                   (char **)(exename.field_2._8_8_ + (long)iVar2 * 8));
        timeout = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        cmSystemTools::RunSingleCommand
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_160,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,
                   (cmDuration)timeout.__r,Auto);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_160);
      }
    }
    local_f0 = 0;
LAB_00112cce:
    std::__cxx11::string::~string((string *)local_c0);
    if (local_f0 != 0) goto LAB_00112d07;
  }
  av_local._4_4_ = 0;
  local_f0 = 1;
LAB_00112d07:
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_30);
  return av_local._4_4_;
}

Assistant:

int main(int ac, char** av)
{
  cmsys::Encoding::CommandLineArguments args =
    cmsys::Encoding::CommandLineArguments::Main(ac, av);
  int argc = args.argc();
  const char* const* argv = args.argv();

  std::string exename = argv[0];
  std::string logarg;
  bool nextarg = false;
  // execute the part after the last argument?
  // the logfile path gets passed as environment variable PSEUDO_LOGFILE
  bool exec = false;

  if (exename.find("valgrind") != std::string::npos) {
    logarg = "--log-file=";
  } else if (exename.find("purify") != std::string::npos) {
#ifdef _WIN32
    logarg = "/SAVETEXTDATA=";
#else
    logarg = "-log-file=";
#endif
  } else if (exename.find("BC") != std::string::npos) {
    nextarg = true;
    logarg = "/X";
  } else if (exename.find("cuda-memcheck") != std::string::npos) {
    nextarg = true;
    exec = true;
    logarg = "--log-file";
  }

  if (!logarg.empty()) {
    std::string logfile;
    for (int i = 1; i < argc; i++) {
      std::string arg = argv[i];
      if (arg.find(logarg) == 0) {
        if (nextarg) {
          if (i == argc - 1) {
            return 1; // invalid command line
          }
          logfile = argv[i + 1];
        } else {
          logfile = arg.substr(logarg.length());
        }
        // keep searching, it may be overridden later to provoke an error
      }
    }

    // find the last argument position
    int lastarg_pos = 1;
    for (int i = 1; i < argc; ++i) {
      std::string arg = argv[i];
      if (arg.find("--") == 0) {
        lastarg_pos = i;
      }
    }

    if (!logfile.empty()) {
      cmSystemTools::Touch(logfile, true);
      // execute everything after the last argument with additional environment
      int callarg_pos = lastarg_pos + (nextarg ? 2 : 1);
      if (exec && callarg_pos < argc) {
        std::vector<std::string> callargs{ CMAKE_COMMAND, "-E", "env",
                                           "PSEUDO_LOGFILE=" + logfile };
        callargs.insert(callargs.end(), &argv[callarg_pos], &argv[argc]);
        cmSystemTools::RunSingleCommand(callargs);
      }
    }
  }

  return RETVAL;
}